

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,DryHandler *handler,bool isKey)

{
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> copy;
  StackStream<char> stackStream;
  GenericStringStream<rapidjson::UTF8<char>_> local_38;
  GenericStringStream<rapidjson::UTF8<char>_> *local_28;
  StackStream<char> local_18;
  
  local_38.src_ = is->src_;
  local_38.head_ = is->head_;
  local_28 = is;
  if (*local_38.src_ == '\"') {
    local_38.src_ = local_38.src_ + 1;
    local_18.length_ = 0;
    local_18.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
    ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
              (this,&local_38,&local_18);
    if (*(int *)(this + 0x30) == 0) {
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      StackStream<char>::Pop(&local_18);
    }
    local_28->src_ = local_38.src_;
    local_28->head_ = local_38.head_;
    return;
  }
  __assert_fail("s.Peek() == \'\\\"\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                ,0x3c1,
                "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseString(InputStream &, Handler &, bool) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
               );
}

Assistant:

~StreamLocalCopy() { original_ = s; }